

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O3

void expr_setup(void)

{
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar1;
  _class *p_Var2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("expr");
  uVar4 = (ulong)uVar3 << 0x20;
  expr_class = class_new(ptVar1,expr_new,expr_ff,0x22c8,0,A_GIMME,uVar4);
  class_addlist(expr_class,expr_list);
  ptVar1 = gensym("exprproxy");
  exprproxy_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x20,1,A_NULL);
  class_doaddfloat(exprproxy_class,exprproxy_float);
  p_Var2 = expr_class;
  ptVar1 = gensym("version");
  class_addmethod(p_Var2,expr_version,ptVar1,A_NULL);
  ptVar1 = gensym("expr~");
  uVar4 = uVar4 & 0xffffffff00000000;
  p_Var2 = class_new(ptVar1,expr_new,expr_ff,0x22c8,0,A_GIMME,uVar4);
  expr_tilde_class = p_Var2;
  ptVar1 = gensym("signal");
  class_addmethod(p_Var2,nullfn,ptVar1,A_NULL);
  class_domainsignalin(expr_tilde_class,0x22c0);
  p_Var2 = expr_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,expr_dsp,ptVar1,A_CANT);
  p_Var2 = expr_tilde_class;
  ptVar1 = gensym("expr");
  class_sethelpsymbol(p_Var2,ptVar1);
  p_Var2 = expr_tilde_class;
  ptVar1 = gensym("version");
  class_addmethod(p_Var2,expr_version,ptVar1,A_NULL);
  ptVar1 = gensym("fexpr~");
  p_Var2 = class_new(ptVar1,expr_new,expr_ff,0x22c8,0,A_GIMME,uVar4 & 0xffffffff00000000);
  fexpr_tilde_class = p_Var2;
  ptVar1 = gensym("signal");
  class_addmethod(p_Var2,nullfn,ptVar1,A_NULL);
  class_domainsignalin(fexpr_tilde_class,0x22c0);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("start");
  class_addmethod(p_Var2,expr_start,ptVar1,A_NULL);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,expr_stop,ptVar1,A_NULL);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,expr_dsp,ptVar1,A_CANT,0);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,fexpr_tilde_set,ptVar1,A_GIMME,0);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("clear");
  class_addmethod(p_Var2,fexpr_tilde_clear,ptVar1,A_GIMME,0);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("verbose");
  class_addmethod(p_Var2,expr_verbose,ptVar1,A_NULL);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("version");
  class_addmethod(p_Var2,expr_version,ptVar1,A_NULL);
  p_Var2 = fexpr_tilde_class;
  ptVar1 = gensym("expr");
  class_sethelpsymbol(p_Var2,ptVar1);
  return;
}

Assistant:

void
expr_setup(void)
{
        /*
         * expr initialization
         */
        expr_class = class_new(gensym("expr"), (t_newmethod)expr_new,
            (t_method)expr_ff, sizeof(t_expr), 0, A_GIMME, 0);
        class_addlist(expr_class, expr_list);
        exprproxy_class = class_new(gensym("exprproxy"), 0,
                                        0, sizeof(t_exprproxy), CLASS_PD, 0);
        class_addfloat(exprproxy_class, exprproxy_float);
        class_addmethod(expr_class,(t_method)expr_version,
                                                        gensym("version"), 0);

        /*
         * expr~ initialization
         */
        expr_tilde_class = class_new(gensym("expr~"), (t_newmethod)expr_new,
            (t_method)expr_ff, sizeof(t_expr), 0, A_GIMME, 0);
        class_addmethod(expr_tilde_class, nullfn, gensym("signal"), 0);
        CLASS_MAINSIGNALIN(expr_tilde_class, t_expr, exp_f);
        class_addmethod(expr_tilde_class,(t_method)expr_dsp, gensym("dsp"),
                                                        A_CANT, 0);
        class_sethelpsymbol(expr_tilde_class, gensym("expr"));
        class_addmethod(expr_tilde_class,(t_method)expr_version,
                                                        gensym("version"), 0);
        /*
         * fexpr~ initialization
         */
        fexpr_tilde_class = class_new(gensym("fexpr~"), (t_newmethod)expr_new,
            (t_method)expr_ff, sizeof(t_expr), 0, A_GIMME, 0);
        class_addmethod(fexpr_tilde_class, nullfn, gensym("signal"), 0);
        CLASS_MAINSIGNALIN(fexpr_tilde_class, t_expr, exp_f);
        class_addmethod(fexpr_tilde_class,(t_method)expr_start,
                                                        gensym("start"), 0);
        class_addmethod(fexpr_tilde_class,(t_method)expr_stop,
                                                        gensym("stop"), 0);

        class_addmethod(fexpr_tilde_class,(t_method)expr_dsp,gensym("dsp"),
                                                        A_CANT, 0);
        class_addmethod(fexpr_tilde_class, (t_method)fexpr_tilde_set,
                        gensym("set"), A_GIMME, 0);
        class_addmethod(fexpr_tilde_class, (t_method)fexpr_tilde_clear,
                        gensym("clear"), A_GIMME, 0);
        class_addmethod(fexpr_tilde_class,(t_method)expr_verbose,
                                                        gensym("verbose"), 0);
        class_addmethod(fexpr_tilde_class,(t_method)expr_version,
                                                        gensym("version"), 0);
        class_sethelpsymbol(fexpr_tilde_class, gensym("expr"));

}